

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

ImageChannelValues * __thiscall
pbrt::Image::MSE(ImageChannelValues *__return_storage_ptr__,Image *this,ImageChannelDesc *desc,
                Image *ref,Image *mseImage)

{
  Tuple2<pbrt::Point2,_int> TVar1;
  size_t sVar2;
  float fVar3;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *pIVar4;
  Allocator alloc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar7;
  ulong uVar8;
  Image *pIVar9;
  size_t sVar10;
  ulong uVar11;
  long lVar12;
  Point2i PVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  allocator_type local_179;
  long local_178;
  Image *local_170;
  Image *local_168;
  Image *local_160;
  vector<double,_std::allocator<double>_> sumSE;
  Point2i vb;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *local_110;
  ulong local_108;
  Point2i va;
  int local_f8;
  undefined4 uStack_f4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  ColorEncodingHandle local_d0;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> local_c8;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> local_a8;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_88;
  ColorEncodingHandle local_68;
  ImageChannelDesc refDesc;
  
  va.super_Tuple2<pbrt::Point2,_int>.x = 0;
  va.super_Tuple2<pbrt::Point2,_int>.y = 0;
  std::vector<double,_std::allocator<double>_>::vector
            (&sumSE,(desc->offset).nStored,(value_type_conflict3 *)&va,(allocator_type *)&refDesc);
  ChannelNames_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&va,this,desc);
  requestedChannels.n = CONCAT44(uStack_f4,local_f8) - (long)va.super_Tuple2<pbrt::Point2,_int> >> 5
  ;
  requestedChannels.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       va.super_Tuple2<pbrt::Point2,_int>;
  GetChannelDesc(&refDesc,ref,requestedChannels);
  local_160 = ref;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&va);
  if (refDesc.offset.nStored == 0) {
    ChannelNames_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&va,this,desc);
    ErrorExit<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ("Channels not found in image: %s",
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&va);
  }
  TVar1 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
  vb.super_Tuple2<pbrt::Point2,_int> = (local_160->resolution).super_Tuple2<pbrt::Point2,_int>;
  auVar14._8_8_ = 0;
  auVar14._0_4_ = TVar1.x;
  auVar14._4_4_ = TVar1.y;
  auVar15._8_8_ = 0;
  auVar15._0_4_ = vb.super_Tuple2<pbrt::Point2,_int>.x;
  auVar15._4_4_ = vb.super_Tuple2<pbrt::Point2,_int>.y;
  uVar11 = vpcmpd_avx512vl(auVar14,auVar15,4);
  va.super_Tuple2<pbrt::Point2,_int> = TVar1;
  if ((uVar11 & 3) == 0) {
    local_170 = mseImage;
    local_168 = this;
    if (mseImage != (Image *)0x0) {
      pbVar6 = (this->channelNames).ptr;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      vector<std::__cxx11::string_const*,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vb,pbVar6,
                 pbVar6 + (this->channelNames).nStored,&local_179);
      PVar13.super_Tuple2<pbrt::Point2,_int> = vb.super_Tuple2<pbrt::Point2,_int>;
      lVar12 = (long)local_138 - (long)vb.super_Tuple2<pbrt::Point2,_int>;
      local_68.
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )0;
      alloc.memoryResource = pstd::pmr::new_delete_resource();
      channels.n = lVar12 >> 5;
      channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     PVar13.super_Tuple2<pbrt::Point2,_int>;
      Image((Image *)&va,Float,(Point2i)TVar1,channels,&local_68,alloc);
      pIVar9 = local_170;
      (local_170->resolution).super_Tuple2<pbrt::Point2,_int>.y = local_f8;
      local_170->format = va.super_Tuple2<pbrt::Point2,_int>.x;
      (local_170->resolution).super_Tuple2<pbrt::Point2,_int>.x =
           va.super_Tuple2<pbrt::Point2,_int>.y;
      pstd::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&local_170->channelNames,&local_f0);
      (pIVar9->encoding).
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits = (uintptr_t)
              local_d0.
              super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
              .bits;
      pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
                (&pIVar9->p8,&local_c8);
      pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
                (&pIVar9->p16,&local_a8);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                (&pIVar9->p32,&local_88);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_88);
      pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector(&local_a8);
      pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
                (&local_c8);
      pstd::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_f0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&vb);
    }
    pIVar9 = local_168;
    local_110 = &__return_storage_ptr__->
                 super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>;
    if (0 < (local_168->resolution).super_Tuple2<pbrt::Point2,_int>.y) {
      local_178 = 0;
      do {
        if (0 < (pIVar9->resolution).super_Tuple2<pbrt::Point2,_int>.x) {
          local_108 = local_178 << 0x20;
          uVar11 = 0;
          do {
            PVar13.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_108 | uVar11)
            ;
            GetChannels((ImageChannelValues *)&va,pIVar9,PVar13,desc,(WrapMode2D)0x200000002);
            GetChannels((ImageChannelValues *)&vb,local_160,PVar13,&refDesc,(WrapMode2D)0x200000002)
            ;
            if ((desc->offset).nStored != 0) {
              uVar8 = 0;
              do {
                pvVar5 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)CONCAT44(uStack_f4,local_f8);
                if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT44(uStack_f4,local_f8) ==
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)0x0) {
                  pvVar5 = &local_f0;
                }
                pbVar6 = local_138;
                if (local_138 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pbVar6 = &local_130;
                }
                fVar3 = *(float *)((long)&(pvVar5->alloc).memoryResource + uVar8 * 4) -
                        *(float *)((long)&(pbVar6->_M_dataplus)._M_p + uVar8 * 4);
                fVar3 = fVar3 * fVar3;
                if (ABS(fVar3) != INFINITY) {
                  sumSE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar8] =
                       (double)fVar3 +
                       sumSE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar8];
                  if (local_170 != (Image *)0x0) {
                    SetChannel(local_170,PVar13,(int)uVar8,fVar3);
                  }
                }
                uVar8 = uVar8 + 1;
              } while (uVar8 < (desc->offset).nStored);
            }
            InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                      ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)&vb);
            InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                      ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)&va);
            uVar11 = uVar11 + 1;
            pIVar9 = local_168;
          } while ((long)uVar11 < (long)(local_168->resolution).super_Tuple2<pbrt::Point2,_int>.x);
        }
        local_178 = local_178 + 1;
      } while (local_178 < (pIVar9->resolution).super_Tuple2<pbrt::Point2,_int>.y);
    }
    sVar2 = (desc->offset).nStored;
    vb.super_Tuple2<pbrt::Point2,_int> = vb.super_Tuple2<pbrt::Point2,_int> & 0xffffffff00000000;
    va.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)pstd::pmr::new_delete_resource()
    ;
    pIVar4 = local_110;
    InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::InlinedVector
              (local_110,sVar2,(float *)&vb,(polymorphic_allocator<float> *)&va);
    sVar2 = (desc->offset).nStored;
    if (sVar2 != 0) {
      paVar7 = &pIVar4->field_2;
      if ((anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
           *)pIVar4->ptr !=
          (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
           *)0x0) {
        paVar7 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                  *)pIVar4->ptr;
      }
      sVar10 = 0;
      do {
        TVar1 = (pIVar9->resolution).super_Tuple2<pbrt::Point2,_int>;
        paVar7->fixed[sVar10] =
             (float)(sumSE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[sVar10] / (double)(TVar1.y * TVar1.x));
        sVar10 = sVar10 + 1;
      } while (sVar2 != sVar10);
    }
    InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector(&refDesc.offset);
    if (sumSE.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(sumSE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)sumSE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)sumSE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return (ImageChannelValues *)pIVar4;
  }
  LogFatal<char_const(&)[13],char_const(&)[17],char_const(&)[13],pbrt::Point2<int>&,char_const(&)[17],pbrt::Point2<int>&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
             ,0x223,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [13])0x469e11,
             (char (*) [17])"ref.Resolution()",(char (*) [13])0x469e11,(Point2<int> *)&va,
             (char (*) [17])"ref.Resolution()",&vb);
}

Assistant:

ImageChannelValues Image::MSE(const ImageChannelDesc &desc, const Image &ref,
                              Image *mseImage) const {
    std::vector<double> sumSE(desc.size(), 0.);

    ImageChannelDesc refDesc = ref.GetChannelDesc(ChannelNames(desc));
    if (!refDesc)
        ErrorExit("Channels not found in image: %s", ChannelNames(desc));

    CHECK_EQ(Resolution(), ref.Resolution());

    if (mseImage)
        *mseImage = Image(PixelFormat::Float, Resolution(), ChannelNames());

    for (int y = 0; y < Resolution().y; ++y)
        for (int x = 0; x < Resolution().x; ++x) {
            ImageChannelValues v = GetChannels({x, y}, desc);
            ImageChannelValues vref = ref.GetChannels({x, y}, refDesc);

            for (int c = 0; c < desc.size(); ++c) {
                Float se = Sqr(v[c] - vref[c]);
                if (std::isinf(se))
                    continue;
                sumSE[c] += se;
                if (mseImage)
                    mseImage->SetChannel({x, y}, c, se);
            }
        }

    ImageChannelValues mse(desc.size());
    for (int c = 0; c < desc.size(); ++c)
        mse[c] = sumSE[c] / (Resolution().x * Resolution().y);
    return mse;
}